

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::ColumnChunk::__set_crypto_metadata(ColumnChunk *this,ColumnCryptoMetaData *val)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema,
              &(val->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::__cxx11::string::_M_assign
            ((string *)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata);
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.__isset =
       (val->ENCRYPTION_WITH_COLUMN_KEY).__isset;
  (this->crypto_metadata).__isset = val->__isset;
  this->__isset = (_ColumnChunk__isset)((byte)this->__isset | 0x40);
  return;
}

Assistant:

void ColumnChunk::__set_crypto_metadata(const ColumnCryptoMetaData& val) {
  this->crypto_metadata = val;
__isset.crypto_metadata = true;
}